

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>::
insert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,capnp::Text::Reader&>
          (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> table,size_t pos,
          Reader *params)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 __n;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  ulong uVar4;
  undefined8 *in_R9;
  Maybe<unsigned_long> MVar5;
  Iterator iter;
  Iterator IStack_78;
  size_t local_60;
  size_t local_58;
  SearchKey local_50;
  Entry *local_48;
  size_t *local_40;
  
  local_60 = table.size_;
  local_48 = table.ptr;
  local_40 = &local_60;
  local_50._vptr_SearchKey = (_func_int **)&PTR_search_0027fb70;
  local_58 = pos;
  kj::_::BTreeImpl::insert
            (&IStack_78,(BTreeImpl *)&(local_48->key).super_StringPtr.content.size_,&local_50);
  uVar3 = (ulong)IStack_78.row;
  if (uVar3 == 0xe) {
    uVar3 = 0xe;
  }
  else {
    uVar1 = (IStack_78.leaf)->rows[uVar3].i;
    if (uVar1 != 0) {
      uVar4 = (ulong)(uVar1 - 1);
      __n = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
            (local_60 + 8 + uVar4 * 0x18))->value;
      if ((__n.value == in_R9[1]) &&
         ((__n.value == 0 ||
          (iVar2 = bcmp(*(void **)(local_60 + uVar4 * 0x18),(void *)*in_R9,__n.value),
          __n = extraout_RDX, iVar2 == 0)))) {
        *this = (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>)0x1;
        *(ulong *)(this + 8) = uVar4;
        goto LAB_001ac953;
      }
    }
  }
  memmove((IStack_78.leaf)->rows + uVar3 + 1,(IStack_78.leaf)->rows + uVar3,
          (ulong)(IStack_78.row + 1) * -4 + 0x38);
  ((IStack_78.leaf)->rows + uVar3 + 1)[-1] = (MaybeUint)((int)params + 1);
  *this = (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>)0x0;
  __n = extraout_RDX_00;
LAB_001ac953:
  MVar5.ptr.field_1.value = __n.value;
  MVar5.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar5.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }